

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_>::erase
          (map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *this,Node *x)

{
  Node *pNVar1;
  Node *in_RSI;
  Node *in_RDI;
  Node *z;
  Node *y;
  color_type col;
  Node *in_stack_ffffffffffffffd8;
  color_type local_14;
  
  local_14 = in_RSI->color;
  if (in_RSI->left == (Node *)in_RDI->value) {
    pNVar1 = in_RSI->right;
    transplant((map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)in_RDI,
               in_RSI,in_RSI->right);
  }
  else if (in_RSI->right == (Node *)in_RDI->value) {
    pNVar1 = in_RSI->left;
    transplant((map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)in_RDI,
               in_RSI,in_RSI->left);
  }
  else {
    in_stack_ffffffffffffffd8 =
         findmin((map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)in_RDI
                 ,in_RSI->right);
    local_14 = in_stack_ffffffffffffffd8->color;
    pNVar1 = in_stack_ffffffffffffffd8->right;
    if (in_stack_ffffffffffffffd8->parent == in_RSI) {
      in_stack_ffffffffffffffd8->right->parent = in_stack_ffffffffffffffd8;
    }
    else {
      transplant((map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)in_RDI
                 ,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd8->right);
      in_stack_ffffffffffffffd8->right = in_RSI->right;
      in_stack_ffffffffffffffd8->right->parent = in_stack_ffffffffffffffd8;
    }
    transplant((map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)in_RDI,
               in_RSI,in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffd8->color = in_RSI->color;
    in_stack_ffffffffffffffd8->left = in_RSI->left;
    in_stack_ffffffffffffffd8->left->parent = in_stack_ffffffffffffffd8;
  }
  if (in_RSI != (Node *)0x0) {
    Node::~Node(in_RDI);
    operator_delete(in_RSI,0x28);
  }
  in_RDI->right = (Node *)((long)&in_RDI->right[-1].parent + 7);
  if (local_14 == BLACK) {
    erase_fixup((map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)pNVar1,
                in_stack_ffffffffffffffd8);
    in_RDI->value[2].first = (long)in_RDI->value;
  }
  pNVar1 = findmin((map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)
                   in_RDI,(Node *)in_RDI->value);
  *(Node **)&in_RDI->color = pNVar1;
  return;
}

Assistant:

void erase(Node *x)
	{
		color_type col = x -> color;Node *y;
		if (x -> left == nil) y = x -> right , transplant(x , x -> right);
		else if (x -> right == nil) y = x -> left , transplant(x , x -> left);
		else
		{
			Node *z = findmin(x -> right);col = z -> color , y = z -> right;
			if (z -> parent == x) z -> right -> parent = z;//assure that nil -> parent = z
			else
			{
				transplant(z , z -> right);
				z -> right = x -> right , z -> right -> parent = z;
			}
			transplant(x , z);
			z -> color = x -> color , z -> left = x -> left , z -> left -> parent = z;
		}
		delete x , -- tot;
		if (col == BLACK) erase_fixup(y) , nil -> parent = nil;
		nodebegin = findmin(nil);
	}